

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
on_bin(int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<char> *specs;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  char *__dest;
  byte *pbVar6;
  ulong uVar7;
  ptrdiff_t _Num;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  string_view prefix;
  write_int_data<char> data;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  buffer<char> *pbVar14;
  write_int_data<char> local_40;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = specs->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  lVar8 = 0;
  uVar5 = (ulong)this->abs_value;
  uVar7 = *(ulong *)((long)&this->abs_value + 8);
  do {
    lVar8 = lVar8 + 1;
    bVar12 = 1 < uVar5;
    bVar13 = uVar7 != 0;
    uVar9 = -uVar7;
    uVar5 = uVar7 << 0x3f | uVar5 >> 1;
    uVar7 = uVar7 >> 1;
  } while (bVar13 || uVar9 < bVar12);
  pbVar14 = (this->out).container;
  uVar7 = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_40,(int)lVar8,prefix,specs);
  uVar5 = (ulong)specs->width;
  if (-1 < (long)uVar5) {
    uVar9 = 0;
    if (local_40.size <= uVar5) {
      uVar9 = uVar5 - local_40.size;
    }
    uVar5 = uVar9 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar3 = pbVar14->size_;
    uVar10 = local_40.size + sVar3 + (specs->fill).size_ * uVar9;
    if (pbVar14->capacity_ < uVar10) {
      (**pbVar14->_vptr_buffer)(pbVar14,uVar10);
    }
    pbVar14->size_ = uVar10;
    __dest = fill<char*,char>(pbVar14->ptr_ + sVar3,uVar5,&specs->fill);
    if (uVar7 != 0) {
      memmove(__dest,this->prefix,uVar7);
      __dest = __dest + uVar7;
    }
    pcVar11 = __dest;
    if (local_40.padding != 0) {
      pcVar11 = __dest + local_40.padding;
      memset(__dest,0x30,local_40.padding);
    }
    pbVar6 = (byte *)(pcVar11 + lVar8);
    uVar7 = (ulong)this->abs_value;
    uVar10 = *(ulong *)((long)&this->abs_value + 8);
    do {
      pbVar6 = pbVar6 + -1;
      *pbVar6 = (byte)uVar7 & 1 | 0x30;
      bVar12 = 1 < uVar7;
      bVar13 = uVar10 != 0;
      uVar4 = -uVar10;
      uVar7 = uVar10 << 0x3f | uVar7 >> 1;
      uVar10 = uVar10 >> 1;
    } while (bVar13 || uVar4 < bVar12);
    fill<char*,char>(pcVar11 + lVar8,uVar9 - uVar5,&specs->fill);
    (this->out).container = pbVar14;
    return;
  }
  assert_fail(in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88);
}

Assistant:

void on_bin() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = static_cast<char>(specs.type);
    }
    int num_digits = count_digits<1>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<1, Char>(it, abs_value, num_digits);
                    });
  }